

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_open(OPEN_HANDLE open)

{
  AMQP_VALUE pAVar1;
  
  if (open != (OPEN_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(open->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_open(OPEN_HANDLE open)
{
    AMQP_VALUE result;

    if (open == NULL)
    {
        result = NULL;
    }
    else
    {
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        result = amqpvalue_clone(open_instance->composite_value);
    }

    return result;
}